

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void __thiscall AActor::UpdateRenderSectorList(AActor *this)

{
  double *pdVar1;
  line_t *ld;
  bool bVar2;
  int iVar3;
  portnode_t *ppVar4;
  msecnode_t *pmVar5;
  subsector_t *psVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  FLinePortal *p;
  sector_t *s;
  FLinePortal *s_00;
  double dVar10;
  double dVar11;
  FBoundingBox bb;
  FBoundingBox local_48;
  
  dVar10 = (this->__Pos).X;
  if ((dVar10 == (this->OldRenderPos).X) && (!NAN(dVar10) && !NAN((this->OldRenderPos).X))) {
    dVar10 = (this->__Pos).Y;
    pdVar1 = &(this->OldRenderPos).Y;
    if ((dVar10 == *pdVar1) && (!NAN(dVar10) && !NAN(*pdVar1))) {
      dVar10 = (this->__Pos).Z;
      pdVar1 = &(this->OldRenderPos).Z;
      if ((dVar10 == *pdVar1) && (!NAN(dVar10) && !NAN(*pdVar1))) {
        return;
      }
    }
  }
  if (((this->flags).Value & 8) == 0) {
    for (ppVar4 = this->render_portallist; ppVar4 != (portnode_t *)0x0;
        ppVar4 = P_DelPortalnode(ppVar4)) {
    }
    this->render_portallist = (portnode_t *)0x0;
    if (PortalBlockmap.containsLines == true) {
      dVar10 = (this->__Pos).X;
      dVar11 = (this->__Pos).Y;
      if ((((dVar10 != (this->OldRenderPos).X) || (NAN(dVar10) || NAN((this->OldRenderPos).X))) ||
          (pdVar1 = &(this->OldRenderPos).Y, dVar11 != *pdVar1)) || (NAN(dVar11) || NAN(*pdVar1))) {
        uVar7 = (uint)((dVar10 - bmaporgx) * 0.0078125);
        uVar8 = (uint)((dVar11 - bmaporgy) * 0.0078125);
        local_48.m_Box[1] = this->radius * 1.5;
        if (128.0 <= local_48.m_Box[1]) {
          local_48.m_Box[1] = 128.0;
        }
        local_48.m_Box[0] = dVar11 + local_48.m_Box[1];
        local_48.m_Box[2] = dVar10 - local_48.m_Box[1];
        local_48.m_Box[3] = dVar10 + local_48.m_Box[1];
        local_48.m_Box[1] = dVar11 - local_48.m_Box[1];
        if (((-1 < (int)(uVar8 | uVar7)) && ((int)uVar7 < bmapwidth)) &&
           (((int)uVar8 < bmapheight &&
            ((PortalBlockmap.data.Array[(int)(uVar8 * PortalBlockmap.dx + uVar7)].
              neighborContainsLines == true && ((ulong)linePortals.Count != 0)))))) {
          lVar9 = (ulong)linePortals.Count * 0x48;
          s_00 = linePortals.Array;
          do {
            if (((((s_00->mType != '\0') && (ld = s_00->mOrigin, local_48.m_Box[2] < ld->bbox[3]))
                 && (ld->bbox[2] <= local_48.m_Box[3] && local_48.m_Box[3] != ld->bbox[2])) &&
                ((ld->bbox[1] <= local_48.m_Box[0] && local_48.m_Box[0] != ld->bbox[1] &&
                 (local_48.m_Box[1] < ld->bbox[0])))) &&
               (iVar3 = FBoundingBox::BoxOnLineSide(&local_48,ld), iVar3 != 0)) {
              ppVar4 = P_AddPortalnode(s_00,this,this->render_portallist);
              this->render_portallist = ppVar4;
            }
            s_00 = s_00 + 1;
            lVar9 = lVar9 + -0x48;
          } while (lVar9 != 0);
        }
      }
    }
    s = this->Sector;
    for (pmVar5 = this->render_sectorlist; pmVar5 != (msecnode_t *)0x0;
        pmVar5 = P_DelSecnode(pmVar5,0x1c0)) {
    }
    this->render_sectorlist = (msecnode_t *)0x0;
    dVar10 = -3.4028234663852886e+38;
    do {
      if ((s->planes[1].Flags & 0x1d0U) != 0x100) break;
      uVar7 = s->Portals[1];
      dVar11 = sectorPortals.Array[uVar7].mPlaneZ;
      if ((dVar11 <= dVar10) || ((this->__Pos).Z + this->Height + 64.0 < dVar11)) {
        bVar2 = false;
        dVar11 = dVar10;
      }
      else {
        psVar6 = P_PointInSubsector((this->__Pos).X + sectorPortals.Array[uVar7].mDisplacement.X,
                                    (this->__Pos).Y + sectorPortals.Array[uVar7].mDisplacement.Y);
        s = psVar6->sector;
        pmVar5 = P_AddSecnode(s,this,this->render_sectorlist,&s->render_thinglist);
        this->render_sectorlist = pmVar5;
        bVar2 = true;
      }
      dVar10 = dVar11;
    } while (bVar2);
    dVar10 = 3.4028234663852886e+38;
    do {
      if ((s->planes[0].Flags & 0x1d0U) != 0x100) {
        return;
      }
      uVar7 = s->Portals[0];
      dVar11 = sectorPortals.Array[uVar7].mPlaneZ;
      if ((dVar10 <= dVar11) || (dVar11 < (this->__Pos).Z + -64.0)) {
        bVar2 = false;
        dVar11 = dVar10;
      }
      else {
        psVar6 = P_PointInSubsector((this->__Pos).X + sectorPortals.Array[uVar7].mDisplacement.X,
                                    (this->__Pos).Y + sectorPortals.Array[uVar7].mDisplacement.Y);
        s = psVar6->sector;
        pmVar5 = P_AddSecnode(s,this,this->render_sectorlist,&s->render_thinglist);
        this->render_sectorlist = pmVar5;
        bVar2 = true;
      }
      dVar10 = dVar11;
    } while (bVar2);
  }
  return;
}

Assistant:

void AActor::UpdateRenderSectorList()
{
	static const double SPRITE_SPACE = 64.;
	if (Pos() != OldRenderPos && !(flags & MF_NOSECTOR))
	{
		// Only check if the map contains line portals
		ClearRenderLineList();
		if (PortalBlockmap.containsLines && Pos().XY() != OldRenderPos.XY())
		{
			int bx = GetBlockX(X());
			int by = GetBlockY(Y());
			FBoundingBox bb(X(), Y(), MIN(radius*1.5, 128.));	// Don't go further than 128 map units, even for large actors
			// Are there any portals near the actor's position?
			if (bx >= 0 && by >= 0 && bx < bmapwidth && by < bmapheight && PortalBlockmap(bx, by).neighborContainsLines)
			{
				// Go through the entire list. In most cases this is faster than setting up a blockmap iterator
				for (auto &p : linePortals)
				{
					if (p.mType == PORTT_VISUAL) continue;
					if (bb.inRange(p.mOrigin) && bb.BoxOnLineSide(p.mOrigin))
					{
						render_portallist = P_AddPortalnode(&p, this, render_portallist);
					}
				}
			}
		}
		sector_t *sec = Sector;
		double lasth = -FLT_MAX;
		ClearRenderSectorList();
		while (!sec->PortalBlocksMovement(sector_t::ceiling))
		{
			double planeh = sec->GetPortalPlaneZ(sector_t::ceiling);
			if (planeh <= lasth) break;	// broken setup.
			if (Top() + SPRITE_SPACE < planeh) break;
			lasth = planeh;
			DVector2 newpos = Pos() + sec->GetPortalDisplacement(sector_t::ceiling);
			sec = P_PointInSector(newpos);
			render_sectorlist = P_AddSecnode(sec, this, render_sectorlist, sec->render_thinglist);
		}
		lasth = FLT_MAX;
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			double planeh = sec->GetPortalPlaneZ(sector_t::floor);
			if (planeh >= lasth) break;	// broken setup.
			if (Z() - SPRITE_SPACE > planeh) break;
			lasth = planeh;
			DVector2 newpos = Pos() + sec->GetPortalDisplacement(sector_t::floor);
			sec = P_PointInSector(newpos);
			render_sectorlist = P_AddSecnode(sec, this, render_sectorlist, sec->render_thinglist);
		}
	}
}